

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_art.hpp
# Opt level: O0

size_t __thiscall
unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
get_current_memory_use
          (mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this)

{
  size_t sVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> guard;
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  
  guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mutex);
  sVar1 = db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
          get_current_memory_use(&this->db_);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return sVar1;
}

Assistant:

[[nodiscard]] auto get_current_memory_use() const {
    const std::lock_guard guard{mutex};
    return db_.get_current_memory_use();
  }